

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O1

void Cgt_SimulationRecord(Cgt_Man_t *p)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  void **ppvVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t __n;
  
  pVVar2 = p->pPart->vObjs;
  if (0 < pVVar2->nSize) {
    ppvVar4 = pVVar2->pArray;
    lVar8 = 0;
    do {
      if (ppvVar4[lVar8] != (void *)0x0) {
        iVar3 = p->pCnf->pVarNums[lVar8];
        if (((long)iVar3 < 0) || (p->pSat->size <= iVar3)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (p->pSat->model[iVar3] == 1) {
          if (p->vPatts->nSize <= lVar8) goto LAB_004e667c;
          puVar1 = (uint *)((long)p->vPatts->pArray[lVar8] + (long)(p->nPatts >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)p->nPatts & 0x1f);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  iVar3 = p->nPatts + 1;
  p->nPatts = iVar3;
  if (iVar3 == p->nPattWords << 5) {
    pVVar2 = p->vPatts;
    lVar8 = (long)pVVar2->nSize;
    if (lVar8 < 2) {
      __assert_fail("Vec_PtrSize(vInfo) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x456,"void Vec_PtrReallocSimInfo(Vec_Ptr_t *)");
    }
    iVar3 = (int)((ulong)((long)pVVar2->pArray[1] - (long)*pVVar2->pArray) >> 2);
    lVar7 = (long)(iVar3 * 2);
    ppvVar4 = (void **)malloc((lVar7 * 4 + 8) * lVar8);
    lVar5 = lVar8 * 8;
    lVar6 = 0;
    do {
      ppvVar4[lVar6] = (void *)((long)ppvVar4 + lVar5);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + lVar7 * 4;
    } while (lVar8 != lVar6);
    lVar5 = 0;
    do {
      if (lVar8 == lVar5) {
LAB_004e667c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      memcpy(ppvVar4[lVar5],pVVar2->pArray[lVar5],(long)(iVar3 << 2));
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar2->nSize);
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    pVVar2->pArray = ppvVar4;
    pVVar2 = p->vPatts;
    if (0 < pVVar2->nSize) {
      __n = (long)p->nPattWords * 4;
      lVar8 = 0;
      do {
        memset((void *)((long)pVVar2->pArray[lVar8] + __n),0,__n);
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar2->nSize);
    }
    p->nPattWords = p->nPattWords << 1;
  }
  return;
}

Assistant:

void Cgt_SimulationRecord( Cgt_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p->pPart, pObj, i )
        if ( sat_solver_var_value( p->pSat, p->pCnf->pVarNums[i] ) )
            Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPatts, i), p->nPatts );
    p->nPatts++;
    if ( p->nPatts == 32 * p->nPattWords )
    {
        Vec_PtrReallocSimInfo( p->vPatts );
        Vec_PtrCleanSimInfo( p->vPatts, p->nPattWords, 2 * p->nPattWords );
        p->nPattWords *= 2;
    }
}